

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

mp_limb_t mpn_div_qr_1_preinv(mp_ptr qp,mp_srcptr np,mp_size_t nn,gmp_div_inverse *inv)

{
  ulong uVar1;
  byte bVar2;
  mp_ptr pmVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  mp_size_t mVar8;
  mp_srcptr pmVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  mp_limb_t mVar14;
  long lVar15;
  mp_limb_t __u;
  ulong uVar16;
  
  if (inv->shift == 0) {
    mVar8 = 0;
    pmVar3 = (mp_srcptr)0x0;
    uVar16 = 0;
  }
  else {
    if (qp == (mp_ptr)0x0) {
      pmVar3 = (mp_ptr)(*gmp_allocate_func)(nn * 8);
      mVar8 = nn;
    }
    else {
      mVar8 = 0;
      pmVar3 = qp;
    }
    pmVar9 = pmVar3 + nn;
    bVar2 = (byte)inv->shift;
    uVar16 = np[nn + -1];
    mVar14 = uVar16 << (bVar2 & 0x3f);
    lVar12 = nn;
    if (nn != 1) {
      do {
        uVar1 = np[lVar12 + -2];
        pmVar9[-1] = uVar1 >> (0x40 - bVar2 & 0x3f) | mVar14;
        mVar14 = uVar1 << (bVar2 & 0x3f);
        pmVar9 = pmVar9 + -1;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 1);
    }
    uVar16 = uVar16 >> (0x40 - bVar2 & 0x3f);
    pmVar9[-1] = mVar14;
    np = pmVar3;
  }
  if (0 < nn) {
    uVar1 = inv->d1;
    uVar4 = inv->di & 0xffffffff;
    uVar5 = inv->di >> 0x20;
    lVar12 = nn + 1;
    do {
      uVar7 = (uVar16 & 0xffffffff) * uVar4;
      uVar6 = (uVar16 >> 0x20) * uVar4;
      lVar15 = (uVar16 >> 0x20) * uVar5;
      uVar10 = (uVar16 & 0xffffffff) * uVar5 + uVar6 + (uVar7 >> 0x20);
      lVar11 = lVar15 + 0x100000000;
      if (uVar6 <= uVar10) {
        lVar11 = lVar15;
      }
      uVar7 = uVar7 & 0xffffffff | uVar10 << 0x20;
      uVar6 = np[lVar12 + -2];
      uVar13 = uVar7 + uVar6;
      lVar11 = uVar16 + 1 + (uVar10 >> 0x20) + lVar11 + (ulong)CARRY8(uVar7,uVar6);
      uVar6 = uVar6 - lVar11 * uVar1;
      uVar16 = 0;
      if (uVar13 < uVar6) {
        uVar16 = uVar1;
      }
      uVar16 = uVar16 + uVar6;
      uVar7 = 0;
      if (uVar1 <= uVar16) {
        uVar7 = uVar1;
      }
      if (qp != (mp_ptr)0x0) {
        qp[lVar12 + -2] = ((lVar11 - (ulong)(uVar13 < uVar6)) + 1) - (ulong)(uVar16 < uVar1);
      }
      uVar16 = uVar16 - uVar7;
      lVar12 = lVar12 + -1;
    } while (1 < lVar12);
  }
  if (mVar8 != 0) {
    (*gmp_free_func)(pmVar3,mVar8 << 3);
  }
  return uVar16 >> ((byte)inv->shift & 0x3f);
}

Assistant:

static mp_limb_t
mpn_div_qr_1_preinv (mp_ptr qp, mp_srcptr np, mp_size_t nn,
		     const struct gmp_div_inverse *inv)
{
  mp_limb_t d, di;
  mp_limb_t r;
  mp_ptr tp = NULL;
  mp_size_t tn = 0;

  if (inv->shift > 0)
    {
      /* Shift, reusing qp area if possible. In-place shift if qp == np. */
      tp = qp;
      if (!tp)
        {
	   tn = nn;
	   tp = gmp_alloc_limbs (tn);
        }
      r = mpn_lshift (tp, np, nn, inv->shift);
      np = tp;
    }
  else
    r = 0;

  d = inv->d1;
  di = inv->di;
  while (--nn >= 0)
    {
      mp_limb_t q;

      gmp_udiv_qrnnd_preinv (q, r, r, np[nn], d, di);
      if (qp)
	qp[nn] = q;
    }
  if (tn)
    gmp_free_limbs (tp, tn);

  return r >> inv->shift;
}